

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O2

BVStatic<2048UL> * __thiscall
BVStatic<65536ul>::GetRange<2048ul>(BVStatic<65536ul> *this,BVIndex startOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BVStatic<2048UL> *pBVar4;
  
  BVStatic<65536UL>::AssertRange((BVStatic<65536UL> *)this,startOffset);
  BVStatic<65536UL>::AssertRange((BVStatic<65536UL> *)this,startOffset + 0x7ff);
  if ((startOffset & 0x3f) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                       ,0x224,"(BVUnit::Offset(startOffset) == 0)",
                       "BVUnit::Offset(startOffset) == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pBVar4 = (BVStatic<2048UL> *)
           BVStatic<65536UL>::BitsFromIndex((BVStatic<65536UL> *)this,startOffset);
  return pBVar4;
}

Assistant:

BVStatic<rangeSize> * GetRange(BVIndex startOffset) const
    {
        AssertRange(startOffset);
        AssertRange(startOffset + rangeSize - 1);

        // Start offset and size must be word-aligned
        Assert(BVUnit::Offset(startOffset) == 0);
        Assert(BVUnit::Offset(rangeSize) == 0);

        return (BVStatic<rangeSize> *)BitsFromIndex(startOffset);
    }